

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O2

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::OpenForInsert
          (GeneratorResponseContext *this,string *filename,string *insertion_point)

{
  Type *this_00;
  StringOutputStream *this_01;
  string *target;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                      (&(this->response_->file_).super_RepeatedPtrFieldBase);
  CodeGeneratorResponse_File::set_name(this_00,filename);
  CodeGeneratorResponse_File::set_insertion_point(this_00,insertion_point);
  this_01 = (StringOutputStream *)operator_new(0x10);
  target = CodeGeneratorResponse_File::mutable_content_abi_cxx11_(this_00);
  io::StringOutputStream::StringOutputStream(this_01,target);
  return &this_01->super_ZeroCopyOutputStream;
}

Assistant:

virtual io::ZeroCopyOutputStream* OpenForInsert(
      const string& filename, const string& insertion_point) {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    file->set_insertion_point(insertion_point);
    return new io::StringOutputStream(file->mutable_content());
  }